

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_> *
__thiscall
vkt::synchronization::anon_unknown_0::CopyImageToBuffer::Support::build
          (MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           *__return_storage_ptr__,Support *this,OperationContext *context,Resource *resource)

{
  DeviceInterface *pDVar1;
  VkDevice pVVar2;
  Allocator *pAVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> data;
  PtrData<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> data_00;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> data_01;
  deUint32 pixelSize;
  Operation *pOVar6;
  TextureFormat format;
  Buffer *pBVar7;
  Image *this_00;
  _func_int **bufferSize;
  VkExtent3D VVar8;
  Buffer *in_stack_ffffffffffffff48;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  *pUVar9;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  local_a8;
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
  *local_98;
  MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  *local_90;
  VkImageCreateInfo local_88;
  
  local_90 = __return_storage_ptr__;
  if (this->m_mode == ACCESS_MODE_READ) {
    pOVar6 = (Operation *)operator_new(0x30);
    pOVar6->_vptr_Operation = (_func_int **)&PTR__ReadImplementation_00c0a6e0;
    pOVar6[1]._vptr_Operation = (_func_int **)context;
    pOVar6[2]._vptr_Operation = (_func_int **)resource;
    pOVar6[3]._vptr_Operation = (_func_int **)0x0;
    pUVar9 = (UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              *)(pOVar6 + 3);
    bufferSize = (_func_int **)
                 getPixelBufferSize((resource->m_imageData).format,&(resource->m_imageData).extent);
    pOVar6[5]._vptr_Operation = bufferSize;
    pp_Var4 = pOVar6[1]._vptr_Operation;
    pDVar1 = (DeviceInterface *)pp_Var4[1];
    pVVar2 = (VkDevice)pp_Var4[3];
    pAVar3 = (Allocator *)pp_Var4[4];
    pBVar7 = (Buffer *)operator_new(0x30);
    makeBufferCreateInfo((VkBufferCreateInfo *)&local_88,(VkDeviceSize)bufferSize,2);
    synchronization::Buffer::Buffer
              (pBVar7,pDVar1,pVVar2,pAVar3,(VkBufferCreateInfo *)&local_88,(MemoryRequirement)0x1);
    local_a8.m_data.ptr = (Buffer *)0x0;
    data_01._8_8_ = pUVar9;
    data_01.ptr = in_stack_ffffffffffffff48;
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    assignData(pUVar9,data_01);
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    ~UniqueBase(&local_a8);
    p_Var5 = pOVar6[3]._vptr_Operation[4];
    memset(*(void **)(p_Var5 + 0x18),0,(size_t)pOVar6[5]._vptr_Operation);
    ::vk::flushMappedMemoryRange
              (pDVar1,pVVar2,(VkDeviceMemory)*(deUint64 *)(p_Var5 + 8),
               *(VkDeviceSize *)(p_Var5 + 0x10),(VkDeviceSize)pOVar6[5]._vptr_Operation);
  }
  else {
    pOVar6 = (Operation *)operator_new(0x70);
    pOVar6->_vptr_Operation = (_func_int **)&PTR__WriteImplementation_00c0a730;
    pOVar6[1]._vptr_Operation = (_func_int **)context;
    pOVar6[2]._vptr_Operation = (_func_int **)resource;
    pOVar6[3]._vptr_Operation = (_func_int **)0x1;
    pOVar6[4]._vptr_Operation = (_func_int **)0x1;
    *(undefined4 *)&pOVar6[5]._vptr_Operation = 1;
    *(undefined8 *)((long)&pOVar6[5]._vptr_Operation + 4) = 1;
    *(undefined8 *)((long)&pOVar6[6]._vptr_Operation + 4) = 0x100000000;
    pOVar6[8]._vptr_Operation = (_func_int **)0x0;
    pUVar9 = (UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              *)(pOVar6 + 8);
    pOVar6[10]._vptr_Operation = (_func_int **)0x0;
    local_98 = (UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                *)(pOVar6 + 10);
    pDVar1 = context->m_vk;
    pVVar2 = context->m_device;
    pAVar3 = context->m_allocator;
    format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    pixelSize = tcu::getPixelSize(format);
    pp_Var4 = pOVar6[2]._vptr_Operation;
    VVar8 = get2DImageExtentWithSize((VkDeviceSize)pp_Var4[5],pixelSize);
    *(VkExtent3D *)(pOVar6 + 0xc) = VVar8;
    pBVar7 = (Buffer *)operator_new(0x30);
    makeBufferCreateInfo((VkBufferCreateInfo *)&local_88,(VkDeviceSize)pp_Var4[5],1);
    synchronization::Buffer::Buffer
              (pBVar7,pDVar1,pVVar2,pAVar3,(VkBufferCreateInfo *)&local_88,(MemoryRequirement)0x1);
    local_a8.m_data.ptr = (Buffer *)0x0;
    data._8_8_ = pUVar9;
    data.ptr = in_stack_ffffffffffffff48;
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    assignData(pUVar9,data);
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    ~UniqueBase(&local_a8);
    p_Var5 = pOVar6[8]._vptr_Operation[4];
    fillPattern(*(void **)(p_Var5 + 0x18),(VkDeviceSize)pOVar6[2]._vptr_Operation[5]);
    ::vk::flushMappedMemoryRange
              (pDVar1,pVVar2,(VkDeviceMemory)*(deUint64 *)(p_Var5 + 8),
               *(VkDeviceSize *)(p_Var5 + 0x10),(VkDeviceSize)pOVar6[2]._vptr_Operation[5]);
    this_00 = (Image *)operator_new(0x30);
    makeImageCreateInfo(&local_88,VK_IMAGE_TYPE_2D,(VkExtent3D *)(pOVar6 + 0xc),
                        VK_FORMAT_R8G8B8A8_UNORM,3);
    synchronization::Image::Image(this_00,pDVar1,pVVar2,pAVar3,&local_88,(MemoryRequirement)0x0);
    local_a8.m_data.ptr = (Buffer *)0x0;
    data_00._8_8_ = pUVar9;
    data_00.ptr = (Image *)in_stack_ffffffffffffff48;
    de::details::
    UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::
    assignData(local_98,data_00);
    de::details::
    UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::
    ~UniqueBase((UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                 *)&local_a8);
  }
  (local_90->
  super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  ).m_data.ptr = pOVar6;
  return local_90;
}

Assistant:

de::MovePtr<Operation> build (OperationContext& context, Resource& resource) const
	{
		if (m_mode == ACCESS_MODE_READ)
			return de::MovePtr<Operation>(new ReadImplementation(context, resource));
		else
			return de::MovePtr<Operation>(new WriteImplementation(context, resource));
	}